

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int var_to_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  int iVar1;
  size_t sVar2;
  
  if (gen_ctx->lr_ctx->scan_vars_num != 0) {
    sVar2 = VARR_intlength(gen_ctx->lr_ctx->var_to_scan_var_map);
    if (var < sVar2) {
      iVar1 = VARR_intget(gen_ctx->lr_ctx->var_to_scan_var_map,(ulong)var);
      return iVar1;
    }
    var = 0xffffffff;
  }
  return var;
}

Assistant:

static int var_to_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (scan_vars_num == 0) return (int) var;
  if (VARR_LENGTH (int, var_to_scan_var_map) <= var) return -1;
  return VARR_GET (int, var_to_scan_var_map, var);
}